

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deserializer.hpp
# Opt level: O1

vector<duckdb::MetaBlockPointer,_true> * __thiscall
duckdb::Deserializer::ReadProperty<duckdb::vector<duckdb::MetaBlockPointer,true>>
          (vector<duckdb::MetaBlockPointer,_true> *__return_storage_ptr__,Deserializer *this,
          field_id_t field_id,char *tag)

{
  pointer *ppMVar1;
  iterator __position;
  int iVar2;
  undefined4 extraout_var;
  undefined6 in_register_00000012;
  vector<duckdb::MetaBlockPointer,_true> *vec;
  long lVar3;
  MetaBlockPointer MVar4;
  MetaBlockPointer local_40;
  
  (*this->_vptr_Deserializer[2])(this,CONCAT62(in_register_00000012,field_id) & 0xffffffff,tag);
  (__return_storage_ptr__->
  super_vector<duckdb::MetaBlockPointer,_std::allocator<duckdb::MetaBlockPointer>_>).
  super__Vector_base<duckdb::MetaBlockPointer,_std::allocator<duckdb::MetaBlockPointer>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super_vector<duckdb::MetaBlockPointer,_std::allocator<duckdb::MetaBlockPointer>_>).
  super__Vector_base<duckdb::MetaBlockPointer,_std::allocator<duckdb::MetaBlockPointer>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->
  super_vector<duckdb::MetaBlockPointer,_std::allocator<duckdb::MetaBlockPointer>_>).
  super__Vector_base<duckdb::MetaBlockPointer,_std::allocator<duckdb::MetaBlockPointer>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  iVar2 = (*this->_vptr_Deserializer[8])(this);
  lVar3 = CONCAT44(extraout_var,iVar2);
  if (lVar3 != 0) {
    do {
      (*this->_vptr_Deserializer[6])(this);
      MVar4 = MetaBlockPointer::Deserialize(this);
      (*this->_vptr_Deserializer[7])(this);
      __position._M_current =
           (__return_storage_ptr__->
           super_vector<duckdb::MetaBlockPointer,_std::allocator<duckdb::MetaBlockPointer>_>).
           super__Vector_base<duckdb::MetaBlockPointer,_std::allocator<duckdb::MetaBlockPointer>_>.
           _M_impl.super__Vector_impl_data._M_finish;
      local_40 = MVar4;
      if (__position._M_current ==
          (__return_storage_ptr__->
          super_vector<duckdb::MetaBlockPointer,_std::allocator<duckdb::MetaBlockPointer>_>).
          super__Vector_base<duckdb::MetaBlockPointer,_std::allocator<duckdb::MetaBlockPointer>_>.
          _M_impl.super__Vector_impl_data._M_end_of_storage) {
        ::std::vector<duckdb::MetaBlockPointer,_std::allocator<duckdb::MetaBlockPointer>_>::
        _M_realloc_insert<duckdb::MetaBlockPointer>
                  (&__return_storage_ptr__->
                    super_vector<duckdb::MetaBlockPointer,_std::allocator<duckdb::MetaBlockPointer>_>
                   ,__position,&local_40);
      }
      else {
        local_40.block_pointer = MVar4.block_pointer;
        local_40._8_8_ = MVar4._8_8_;
        (__position._M_current)->block_pointer = local_40.block_pointer;
        (__position._M_current)->offset = local_40.offset;
        (__position._M_current)->unused_padding = local_40.unused_padding;
        ppMVar1 = &(__return_storage_ptr__->
                   super_vector<duckdb::MetaBlockPointer,_std::allocator<duckdb::MetaBlockPointer>_>
                   ).
                   super__Vector_base<duckdb::MetaBlockPointer,_std::allocator<duckdb::MetaBlockPointer>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
        *ppMVar1 = *ppMVar1 + 1;
      }
      lVar3 = lVar3 + -1;
    } while (lVar3 != 0);
  }
  (*this->_vptr_Deserializer[9])(this);
  (*this->_vptr_Deserializer[3])(this);
  return __return_storage_ptr__;
}

Assistant:

inline T ReadProperty(const field_id_t field_id, const char *tag) {
		OnPropertyBegin(field_id, tag);
		auto ret = Read<T>();
		OnPropertyEnd();
		return ret;
	}